

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_encode_atom.c
# Opt level: O0

void base64_encode_atom(uchar *data,int n,char *out)

{
  uint local_24;
  uint word;
  char *out_local;
  int n_local;
  uchar *data_local;
  
  local_24 = (uint)*data << 0x10;
  if (1 < n) {
    local_24 = (uint)data[1] << 8 | local_24;
  }
  if (2 < n) {
    local_24 = data[2] | local_24;
  }
  *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[local_24 >> 0x12];
  out[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [local_24 >> 0xc & 0x3f];
  if (n < 2) {
    out[2] = '=';
  }
  else {
    out[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [local_24 >> 6 & 0x3f];
  }
  if (n < 3) {
    out[3] = '=';
  }
  else {
    out[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[local_24 & 0x3f];
  }
  return;
}

Assistant:

void base64_encode_atom(const unsigned char *data, int n, char *out)
{
    static const char base64_chars[] =
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    unsigned word;

    word = data[0] << 16;
    if (n > 1)
        word |= data[1] << 8;
    if (n > 2)
        word |= data[2];
    out[0] = base64_chars[(word >> 18) & 0x3F];
    out[1] = base64_chars[(word >> 12) & 0x3F];
    if (n > 1)
        out[2] = base64_chars[(word >> 6) & 0x3F];
    else
        out[2] = '=';
    if (n > 2)
        out[3] = base64_chars[word & 0x3F];
    else
        out[3] = '=';
}